

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrPrimitiveAssembler.hpp
# Opt level: O2

VertexPacket * __thiscall rr::pa::Triangle::getProvokingVertex(Triangle *this)

{
  int iVar1;
  
  iVar1 = this->provokingIndex;
  if (iVar1 == 2) {
    return this->v2;
  }
  if (iVar1 != 1) {
    if (iVar1 == 0) {
      return this->v0;
    }
    return (VertexPacket *)0x0;
  }
  return this->v1;
}

Assistant:

VertexPacket* getProvokingVertex (void)
	{
		switch (provokingIndex)
		{
			case 0: return v0;
			case 1: return v1;
			case 2: return v2;
			default:
				DE_ASSERT(false);
				return DE_NULL;
		}
	}